

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Vertex_*>::~btAlignedObjectArray
          (btAlignedObjectArray<btConvexHullInternal::Vertex_*> *this)

{
  clear(this);
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}